

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCacheRemove(Parse *pParse,int iReg,int nReg)

{
  int iVar1;
  byte bVar2;
  int i;
  
  bVar2 = pParse->nColCache;
  if (bVar2 != 0) {
    i = 0;
    do {
      iVar1 = pParse->aColCache[i].iReg;
      if (iVar1 < nReg + iReg && iReg <= iVar1) {
        cacheEntryClear(pParse,i);
        bVar2 = pParse->nColCache;
      }
      else {
        i = i + 1;
      }
    } while (i < (int)(uint)bVar2);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheRemove(Parse *pParse, int iReg, int nReg){
  int i = 0;
  while( i<pParse->nColCache ){
    struct yColCache *p = &pParse->aColCache[i];
    if( p->iReg >= iReg && p->iReg < iReg+nReg ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}